

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createSphere
          (Vec3fa *center,float radius,Ref<embree::SceneGraph::MaterialNode> *material)

{
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  reference pvVar5;
  unsigned_long *puVar6;
  Vec3fx *pVVar7;
  long *in_RDX;
  float *in_RSI;
  Node *in_RDI;
  float in_XMM0_Da;
  Ref<embree::SceneGraph::PointSetNode> mesh;
  RTCGeometryType type;
  size_t i_3;
  size_t i_2;
  Vec3fx *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  void *in_stack_fffffffffffffd08;
  size_t in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffd90;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  RTCGeometryType type_00;
  PointSetNode *in_stack_fffffffffffffda8;
  BBox1f in_stack_fffffffffffffdb0;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 uStack_1f0;
  long *local_1e0;
  _func_int **local_1d8;
  undefined4 local_1cc;
  float local_1bc;
  float *local_1b8;
  long **local_1a0;
  undefined4 *local_198;
  undefined4 *local_190;
  undefined4 *local_188;
  long **local_180;
  _func_int **local_170;
  _func_int ***local_168;
  _func_int ***local_160;
  _func_int ***local_158;
  _func_int ***local_150;
  _func_int ***local_148;
  _func_int ***local_140;
  undefined8 local_138;
  reference local_130;
  undefined8 local_128;
  reference local_120;
  undefined8 local_118;
  reference local_110;
  undefined8 local_108;
  reference local_100;
  undefined8 local_f8;
  reference local_f0;
  _func_int ***local_e8;
  _func_int ***local_d8;
  _func_int **local_c8;
  ulong local_b8;
  ulong local_b0;
  Vec3fx *local_a8;
  ulong local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  reference local_80;
  size_t local_78;
  reference local_70;
  Vec3fx *local_68;
  Vec3fx *local_60;
  size_t local_58;
  Vec3fx *local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  Vec3fx *local_10;
  Vec3fx *local_8;
  
  type_00 = (RTCGeometryType)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  local_1cc = 0x32;
  local_1bc = in_XMM0_Da;
  local_1b8 = in_RSI;
  pp_Var4 = (_func_int **)::operator_new(0xb0);
  local_1a0 = &local_1e0;
  local_1e0 = (long *)*in_RDX;
  if (local_1e0 != (long *)0x0) {
    (**(code **)(*local_1e0 + 0x10))();
  }
  local_1f8 = 0;
  local_1fc = 0x3f800000;
  local_188 = &local_1f4;
  local_190 = &local_1f8;
  local_198 = &local_1fc;
  local_1f4 = 0;
  uStack_1f0 = 0x3f800000;
  PointSetNode::PointSetNode
            (in_stack_fffffffffffffda8,type_00,in_stack_fffffffffffffd98,in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffd90);
  local_168 = &local_1d8;
  local_170 = pp_Var4;
  local_1d8 = pp_Var4;
  if (pp_Var4 != (_func_int **)0x0) {
    (**(code **)(*pp_Var4 + 0x10))();
  }
  local_180 = &local_1e0;
  if (local_1e0 != (long *)0x0) {
    (**(code **)(*local_1e0 + 0x18))();
  }
  local_140 = &local_1d8;
  pvVar5 = std::
           vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)(local_1d8 + 0xf),0);
  local_138 = 1;
  local_88 = 1;
  local_28 = 1;
  local_130 = pvVar5;
  local_20 = pvVar5;
  if (pvVar5->size_alloced == 0) {
    if (pvVar5->size_alloced == 0) {
      local_18 = 1;
    }
    else {
      local_30 = pvVar5->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar6 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar6;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar5->size_alloced;
  }
  local_90 = local_18;
  uVar3 = local_88;
  if (local_88 < pvVar5->size_active) {
    while (local_98 = uVar3, local_98 < pvVar5->size_active) {
      uVar3 = local_98 + 1;
    }
    pvVar5->size_active = local_88;
  }
  local_80 = pvVar5;
  if (local_18 == pvVar5->size_alloced) {
    for (local_a0 = pvVar5->size_active; local_a0 < local_88; local_a0 = local_a0 + 1) {
      local_10 = pvVar5->items + local_a0;
    }
    pvVar5->size_active = local_88;
  }
  else {
    local_a8 = pvVar5->items;
    local_78 = local_18;
    local_70 = pvVar5;
    pVVar7 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    pvVar5->items = pVVar7;
    for (local_b0 = 0; local_b0 < pvVar5->size_active; local_b0 = local_b0 + 1) {
      local_60 = pvVar5->items + local_b0;
      local_68 = local_a8 + local_b0;
      uVar2 = *(undefined8 *)((long)&local_68->field_0 + 8);
      *(undefined8 *)&local_60->field_0 = *(undefined8 *)&local_68->field_0;
      *(undefined8 *)((long)&local_60->field_0 + 8) = uVar2;
    }
    for (local_b8 = pvVar5->size_active; local_b8 < local_88; local_b8 = local_b8 + 1) {
      local_8 = pvVar5->items + local_b8;
    }
    local_58 = pvVar5->size_alloced;
    local_50 = local_a8;
    local_48 = pvVar5;
    alignedFree(in_stack_fffffffffffffd08);
    pvVar5->size_active = local_88;
    pvVar5->size_alloced = local_90;
  }
  fVar1 = *local_1b8;
  local_148 = &local_1d8;
  local_f0 = std::
             vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           *)(local_1d8 + 0xf),0);
  local_f8 = 0;
  (local_f0->items->field_0).m128[0] = fVar1;
  fVar1 = local_1b8[1];
  local_150 = &local_1d8;
  local_100 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(local_1d8 + 0xf),0);
  local_108 = 0;
  (local_100->items->field_0).m128[1] = fVar1;
  fVar1 = local_1b8[2];
  local_158 = &local_1d8;
  local_110 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(local_1d8 + 0xf),0);
  local_118 = 0;
  (local_110->items->field_0).m128[2] = fVar1;
  local_160 = &local_1d8;
  local_120 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(local_1d8 + 0xf),0);
  local_128 = 0;
  (local_120->items->field_0).m128[3] = local_1bc;
  local_e8 = &local_1d8;
  local_c8 = local_1d8;
  (in_RDI->super_RefCount)._vptr_RefCount = local_1d8;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_d8 = &local_1d8;
  if (local_1d8 != (_func_int **)0x0) {
    (**(code **)(*local_1d8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSphere (const Vec3fa& center, const float radius, Ref<MaterialNode> material)
  {
    RTCGeometryType type = RTC_GEOMETRY_TYPE_SPHERE_POINT;
    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type, material, BBox1f(0,1), 1);
    mesh->positions[0].resize(1);
    mesh->positions[0][0].x = center.x;
    mesh->positions[0][0].y = center.y;
    mesh->positions[0][0].z = center.z;
    mesh->positions[0][0].w = radius;
    return mesh.dynamicCast<SceneGraph::Node>();
  }